

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

void __thiscall PruneReplayer::access_pipeline_layout(PruneReplayer *this,Hash hash)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  mapped_type pVVar1;
  size_type sVar2;
  mapped_type *ppVVar3;
  __hashtable *__h;
  ulong uVar4;
  __node_gen_type __node_gen;
  Hash local_28;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_20;
  
  if (hash != 0) {
    this_00 = &this->accessed_pipeline_layouts;
    local_28 = hash;
    sVar2 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,&local_28);
    if (sVar2 == 0) {
      local_20 = this_00;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00,&local_28);
      ppVVar3 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkPipelineLayoutCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->pipeline_layouts,&local_28);
      pVVar1 = *ppVVar3;
      if ((pVVar1 != (mapped_type)0x0) && (pVVar1->setLayoutCount != 0)) {
        uVar4 = 0;
        do {
          access_descriptor_set(this,(Hash)pVVar1->pSetLayouts[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar4 < pVVar1->setLayoutCount);
      }
    }
  }
  return;
}

Assistant:

void access_pipeline_layout(Hash hash)
	{
		if (!hash)
			return;
		if (accessed_pipeline_layouts.count(hash))
			return;
		accessed_pipeline_layouts.insert(hash);

		auto *create_info = pipeline_layouts[hash];
		if (!create_info)
			return;

		for (uint32_t layout = 0; layout < create_info->setLayoutCount; layout++)
			access_descriptor_set((Hash)create_info->pSetLayouts[layout]);
	}